

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VPrintFile_Serial(N_Vector x,FILE *outfile)

{
  int iVar1;
  long lVar2;
  FILE *in_RSI;
  long *in_RDI;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  int local_14;
  
  iVar1 = *(int *)*in_RDI;
  lVar2 = *(long *)(*in_RDI + 8);
  for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
    fprintf(in_RSI,"%19.16e\n",*(undefined8 *)(lVar2 + (long)local_14 * 8));
  }
  fprintf(in_RSI,"\n");
  return;
}

Assistant:

void N_VPrintFile_Serial(N_Vector x, FILE* outfile)
{
  sunindextype i, N;
  realtype *xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
    fprintf(outfile, "%35.32Le\n", xd[i]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    fprintf(outfile, "%19.16e\n", xd[i]);
#else
    fprintf(outfile, "%11.8e\n", xd[i]);
#endif
  }
  fprintf(outfile, "\n");

  return;
}